

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.cpp
# Opt level: O1

SimpleDictionaryTypeHandler * __thiscall
Js::DeferredTypeHandlerBase::ConvertToSimpleDictionaryType
          (DeferredTypeHandlerBase *this,DynamicObject *instance,int initSlotCapacity,BOOL isProto)

{
  int *piVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *pSVar5;
  
  if (0xfffe < initSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x92,
                                "(initSlotCapacity <= SimpleDictionaryTypeHandler::MaxPropertyIndexSize)"
                                ,
                                "initSlotCapacity <= SimpleDictionaryTypeHandler::MaxPropertyIndexSize"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar5 = ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                     (this,instance,initSlotCapacity,isProto);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertDeferredToSimpleDictionaryCount
  ;
  *piVar1 = *piVar1 + 1;
  return pSVar5;
}

Assistant:

SimpleDictionaryTypeHandler* DeferredTypeHandlerBase::ConvertToSimpleDictionaryType(DynamicObject* instance, int initSlotCapacity, BOOL isProto)
    {
        // DeferredTypeHandler is only used internally by the type system. "initSlotCapacity" should be a tiny number.
        Assert(initSlotCapacity <= SimpleDictionaryTypeHandler::MaxPropertyIndexSize);

        SimpleDictionaryTypeHandler* newTypeHandler = ConvertToTypeHandler<SimpleDictionaryTypeHandler>(instance, initSlotCapacity, isProto);

    #ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertDeferredToSimpleDictionaryCount++;
    #endif
        return newTypeHandler;
    }